

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall chrono::ChMatterSPH::ResizeNnodes(ChMatterSPH *this,int newsize)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  ChCollisionModel *pCVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 local_69;
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined8 local_58;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  iVar9 = (*(this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[10])();
  SetCollide(this,false);
  std::
  vector<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>::
  resize(&this->nodes,(long)newsize);
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->nodes).
      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    uVar11 = 1;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = _Stack_60._M_pi;
      _local_68 = auVar6 << 0x40;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::ChNodeSPH,std::allocator<chrono::ChNodeSPH>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),(ChNodeSPH **)local_68
                 ,(allocator<chrono::ChNodeSPH> *)&local_69);
      psVar1 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar7 = local_68;
      _Var8._M_pi = _Stack_60._M_pi;
      _local_68 = ZEXT816(0);
      p_Var2 = psVar1[uVar10].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      psVar1 = psVar1 + uVar10;
      (psVar1->super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)auVar7;
      (psVar1->super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = _Var8._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
      }
      peVar3 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].
               super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar3->container = this;
      (peVar3->variables).user_data = this;
      local_48 = (this->matsurface).
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Stack_40 = (this->matsurface).
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      pCVar4 = peVar3->collision_model;
      p_Var2 = (this->matsurface).
               super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      _local_68 = ZEXT816(0) << 0x20;
      local_58 = 0;
      (**(code **)((long)pCVar4->_vptr_ChCollisionModel + 0x98))
                (0x3f50624dd2f1a9fc,pCVar4,&local_48,local_68);
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      (**(code **)((long)((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar10].
                          super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->collision_model->_vptr_ChCollisionModel + 0x20))();
      bVar5 = uVar11 < (ulong)((long)(this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
      uVar10 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar5);
  }
  SetCollide(this,SUB41(iVar9,0));
  return;
}

Assistant:

void ChMatterSPH::ResizeNnodes(int newsize) {
    bool oldcoll = GetCollide();
    SetCollide(false);  // this will remove old particle coll.models from coll.engine, if previously added

    /*
    for (unsigned int j = 0; j < nodes.size(); j++)
    {
        //delete (nodes[j]);  ***not needed since using shared ptrs
        nodes[j] = 0;
    }
    */
    nodes.resize(newsize);

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j] = chrono_types::make_shared<ChNodeSPH>();

        nodes[j]->SetContainer(this);

        nodes[j]->variables.SetUserData((void*)this);  // UserData unuseful in future cuda solver?
        //((ChCollisionModelBullet*)nodes[j]->collision_model)->SetContactable(nodes[j]);
        nodes[j]->collision_model->AddPoint(matsurface, 0.001);  //***TEST***
        nodes[j]->collision_model->BuildModel();
    }

    SetCollide(oldcoll);  // this will also add particle coll.models to coll.engine, if already in a ChSystem
}